

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsShaderPerformanceMeasurer.cpp
# Opt level: O0

void __thiscall deqp::gls::ShaderPerformanceMeasurer::iterate(ShaderPerformanceMeasurer *this)

{
  int iVar1;
  deUint32 err;
  undefined4 extraout_var;
  size_type sVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  Result local_68;
  double local_60;
  double mvertPerSecond;
  double mfragPerSecond;
  deInt64 numVertices;
  deInt64 numPixels;
  deInt64 numQuadGrids;
  deUint64 dStack_30;
  int numFrames;
  deUint64 totalTime;
  MeasureState *measureState;
  deUint64 dStack_18;
  State calibratorState;
  deUint64 renderStartTime;
  ShaderPerformanceMeasurer *this_local;
  undefined4 uVar5;
  
  renderStartTime = (deUint64)this;
  dStack_18 = deGetMicroseconds();
  iVar1 = TheilSenCalibrator::getCallCount(&this->m_calibrator);
  render(this,iVar1);
  measureState._4_4_ = TheilSenCalibrator::getState(&this->m_calibrator);
  if (measureState._4_4_ == STATE_RECOMPUTE_PARAMS) {
    TheilSenCalibrator::recomputeParameters(&this->m_calibrator);
    this->m_isFirstIteration = true;
    this->m_prevRenderStartTime = dStack_18;
  }
  else if (measureState._4_4_ == STATE_MEASURE) {
    if ((this->m_isFirstIteration & 1U) == 0) {
      TheilSenCalibrator::recordIteration
                (&this->m_calibrator,dStack_18 - this->m_prevRenderStartTime);
    }
    this->m_isFirstIteration = false;
    this->m_prevRenderStartTime = dStack_18;
  }
  else {
    iVar1 = (*this->m_renderCtx->_vptr_RenderContext[3])();
    err = (**(code **)(CONCAT44(extraout_var,iVar1) + 0x800))();
    glu::checkError(err,"End of rendering",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/glshared/glsShaderPerformanceMeasurer.cpp"
                    ,0x129);
    totalTime = (deUint64)TheilSenCalibrator::getMeasureState(&this->m_calibrator);
    dStack_30 = MeasureState::getTotalTime((MeasureState *)totalTime);
    sVar2 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::size
                      ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)(totalTime + 0x10));
    numQuadGrids._4_4_ = (int)sVar2;
    numPixels = (deInt64)(*(int *)(totalTime + 8) * numQuadGrids._4_4_);
    numVertices = (long)this->m_viewportWidth * (long)this->m_viewportHeight * numPixels;
    iVar1 = getNumVertices(this->m_gridSizeX,this->m_gridSizeY);
    mfragPerSecond = (double)(iVar1 * numPixels);
    uVar5 = (undefined4)(dStack_30 >> 0x20);
    auVar3._8_4_ = uVar5;
    auVar3._0_8_ = dStack_30;
    auVar3._12_4_ = 0x45300000;
    mvertPerSecond =
         (double)numVertices /
         ((auVar3._8_8_ - 1.9342813113834067e+25) +
         ((double)CONCAT44(0x43300000,(int)dStack_30) - 4503599627370496.0));
    auVar4._8_4_ = uVar5;
    auVar4._0_8_ = dStack_30;
    auVar4._12_4_ = 0x45300000;
    local_60 = (double)(long)mfragPerSecond /
               ((auVar4._8_8_ - 1.9342813113834067e+25) +
               ((double)CONCAT44(0x43300000,(int)dStack_30) - 4503599627370496.0));
    Result::Result(&local_68,(float)local_60,(float)mvertPerSecond);
    this->m_result = local_68;
    this->m_state = STATE_FINISHED;
  }
  return;
}

Assistant:

void ShaderPerformanceMeasurer::iterate (void)
{
	DE_ASSERT(m_state == STATE_MEASURING);

	deUint64 renderStartTime = deGetMicroseconds();
	render(m_calibrator.getCallCount()); // Always render. This gives more stable performance behavior.

	TheilSenCalibrator::State calibratorState = m_calibrator.getState();

	if (calibratorState == TheilSenCalibrator::STATE_RECOMPUTE_PARAMS)
	{
		m_calibrator.recomputeParameters();

		m_isFirstIteration = true;
		m_prevRenderStartTime = renderStartTime;
	}
	else if (calibratorState == TheilSenCalibrator::STATE_MEASURE)
	{
		if (!m_isFirstIteration)
			m_calibrator.recordIteration(renderStartTime - m_prevRenderStartTime);

		m_isFirstIteration = false;
		m_prevRenderStartTime = renderStartTime;
	}
	else
	{
		DE_ASSERT(calibratorState == TheilSenCalibrator::STATE_FINISHED);

		GLU_EXPECT_NO_ERROR(m_renderCtx.getFunctions().getError(), "End of rendering");

		const MeasureState& measureState = m_calibrator.getMeasureState();

		// Compute result.
		deUint64	totalTime			= measureState.getTotalTime();
		int			numFrames			= (int)measureState.frameTimes.size();
		deInt64		numQuadGrids		= measureState.numDrawCalls * numFrames;
		deInt64		numPixels			= (deInt64)m_viewportWidth * (deInt64)m_viewportHeight * numQuadGrids;
		deInt64		numVertices			= (deInt64)getNumVertices(m_gridSizeX, m_gridSizeY) * numQuadGrids;
		double		mfragPerSecond		= (double)numPixels / (double)totalTime;
		double		mvertPerSecond		= (double)numVertices / (double)totalTime;

		m_result = Result((float)mvertPerSecond, (float)mfragPerSecond);
		m_state = STATE_FINISHED;
	}
}